

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

vm_obj_id_t __thiscall CVmObjFixup::get_new_id(CVmObjFixup *this,vm_obj_id_t old_id)

{
  obj_fixup_entry *poVar1;
  
  if (((old_id == 0) || ((uint)((int)G_obj_table_X.pages_used_ << 0xc) <= old_id)) ||
     ((*(ushort *)&G_obj_table_X.pages_[old_id >> 0xc][old_id & 0xfff].field_0x14 & 3) != 2)) {
    poVar1 = find_entry(this,old_id);
    if (poVar1 != (obj_fixup_entry *)0x0) {
      old_id = poVar1->new_id;
    }
  }
  return old_id;
}

Assistant:

vm_obj_id_t CVmObjFixup::get_new_id(VMG_ vm_obj_id_t old_id)
{
    /* 
     *   if it's a root-set object, don't bother even trying to translate
     *   it, because root-set objects have stable ID's that never change on
     *   saving or restoring 
     */
    if (G_obj_table->is_obj_id_valid(old_id)
        && G_obj_table->is_obj_in_root_set(old_id))
        return old_id;

    /* find the entry by the object ID */
    obj_fixup_entry *entry = find_entry(old_id);
    
    /* 
     *   if we found it, return the new ID; otherwise, return the old ID
     *   unchanged, since the ID evidently doesn't require mapping 
     */
    return (entry != 0 ? entry->new_id : old_id);
}